

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_band.c
# Opt level: O3

int SUNMatMatvec_Band(SUNMatrix A,N_Vector x,N_Vector y)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  SUNMatrix_ID SVar7;
  N_Vector_ID NVar8;
  realtype *prVar9;
  realtype *__s;
  long lVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  
  SVar7 = SUNMatGetID(A);
  iVar11 = 1;
  if (SVar7 == SUNMATRIX_BAND) {
    NVar8 = N_VGetVectorID(x);
    if (((NVar8 != SUNDIALS_NVEC_SERIAL) &&
        (NVar8 = N_VGetVectorID(x), NVar8 != SUNDIALS_NVEC_OPENMP)) &&
       (NVar8 = N_VGetVectorID(x), NVar8 != SUNDIALS_NVEC_PTHREADS)) {
      return 1;
    }
    prVar9 = N_VGetArrayPointer(x);
    __s = N_VGetArrayPointer(y);
    if (prVar9 != __s && (__s != (realtype *)0x0 && prVar9 != (realtype *)0x0)) {
      plVar1 = (long *)A->content;
      lVar2 = *plVar1;
      if (0 < lVar2) {
        memset(__s,0,lVar2 * 8);
      }
      lVar3 = plVar1[1];
      if (0 < lVar3) {
        lVar4 = plVar1[8];
        lVar5 = plVar1[3];
        lVar6 = plVar1[4];
        lVar13 = -lVar5;
        lVar10 = plVar1[5] << 3;
        lVar14 = 0;
        do {
          lVar15 = 0;
          if (0 < lVar13) {
            lVar15 = lVar13;
          }
          lVar12 = lVar14 - lVar5;
          if (lVar12 < 1) {
            lVar12 = 0;
          }
          lVar16 = lVar6 + lVar14;
          if (lVar2 <= lVar6 + lVar14) {
            lVar16 = lVar2 + -1;
          }
          if (lVar12 <= lVar16) {
            lVar15 = lVar15 + -1;
            lVar12 = *(long *)(lVar4 + lVar14 * 8);
            do {
              __s[lVar15 + 1] =
                   *(double *)(lVar12 + lVar10 + 8 + lVar15 * 8) * prVar9[lVar14] + __s[lVar15 + 1];
              lVar15 = lVar15 + 1;
            } while (lVar15 < lVar16);
          }
          lVar14 = lVar14 + 1;
          lVar13 = lVar13 + 1;
          lVar10 = lVar10 + -8;
        } while (lVar14 != lVar3);
      }
      iVar11 = 0;
    }
  }
  return iVar11;
}

Assistant:

int SUNMatMatvec_Band(SUNMatrix A, N_Vector x, N_Vector y)
{
  sunindextype i, j, is, ie;
  realtype *col_j, *xd, *yd;
  
  /* Verify that A, x and y are compatible */
  if (!SMCompatible2_Band(A, x, y))
    return 1;

  /* access vector data (return if failure) */
  xd = N_VGetArrayPointer(x);
  yd = N_VGetArrayPointer(y);
  if ((xd == NULL) || (yd == NULL) || (xd == yd))
    return 1;

  /* Perform operation */
  for (i=0; i<SM_ROWS_B(A); i++)
    yd[i] = ZERO;
  for(j=0; j<SM_COLUMNS_B(A); j++) {
    col_j = SM_COLUMN_B(A,j);
    is = SUNMAX(0, j-SM_UBAND_B(A));
    ie = SUNMIN(SM_ROWS_B(A)-1, j+SM_LBAND_B(A));
    for (i=is; i<=ie; i++)
      yd[i] += col_j[i-j]*xd[j];
  }
  return 0;
}